

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_GroupsBanned_Test::
~ParseEditionsTest_GroupsBanned_Test(ParseEditionsTest_GroupsBanned_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseEditionsTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, GroupsBanned) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        message TestMessage {
          group TestGroup = 1 {};
        })schema",
      "3:10: Group syntax is no longer supported in editions. To get group "
      "behavior you can specify features.message_encoding = DELIMITED on a "
      "message field.\n");
}